

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void cleanup_constants(void)

{
  cleanup_critical_levels(z_info->m_crit_level_head);
  cleanup_critical_levels(z_info->r_crit_level_head);
  mem_free(z_info);
  return;
}

Assistant:

static void cleanup_constants(void)
{
	cleanup_critical_levels(z_info->m_crit_level_head);
	cleanup_critical_levels(z_info->r_crit_level_head);
	mem_free(z_info);
}